

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::EmptyComputeShaderCase::iterate
          (EmptyComputeShaderCase *this)

{
  code *pcVar1;
  bool bVar2;
  ContextType type;
  GLSLVersion version;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  char *pcVar6;
  ostream *poVar7;
  ProgramSources *sources;
  undefined4 extraout_var;
  TestLog *log;
  TestError *this_00;
  Functions *gl;
  ShaderSource local_368;
  ProgramSources local_340;
  undefined1 local_270 [8];
  ShaderProgram program;
  ostringstream local_190 [8];
  ostringstream src;
  GLSLVersion glslVersion;
  EmptyComputeShaderCase *this_local;
  long lVar8;
  
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  type.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  std::__cxx11::ostringstream::ostringstream(local_190);
  pcVar6 = glu::getGLSLVersionDeclaration(version);
  poVar7 = std::operator<<((ostream *)local_190,pcVar6);
  poVar7 = std::operator<<(poVar7,"\n");
  std::operator<<(poVar7,"layout (local_size_x = 1) in;\nvoid main (void) {}\n");
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_340);
  std::__cxx11::ostringstream::str();
  glu::ShaderSource::ShaderSource(&local_368,SHADERTYPE_COMPUTE,(string *)&gl);
  sources = glu::ProgramSources::operator<<(&local_340,&local_368);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_270,pRVar5,sources);
  glu::ShaderSource::~ShaderSource(&local_368);
  std::__cxx11::string::~string((string *)&gl);
  glu::ProgramSources::~ProgramSources(&local_340);
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(log,(ShaderProgram *)local_270);
  bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_270);
  if (!bVar2) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x6b);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pcVar1 = *(code **)(lVar8 + 0x1680);
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_270);
  (*pcVar1)(dVar4);
  (**(code **)(lVar8 + 0x528))(1,1);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"glDispatchCompute()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x6f);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_270);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const GLSLVersion	glslVersion = glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		std::ostringstream	src;

		src << getGLSLVersionDeclaration(glslVersion) << "\n"
			<< "layout (local_size_x = 1) in;\n"
			   "void main (void) {}\n";

		const ShaderProgram program(m_context.getRenderContext(),
			ProgramSources() << ShaderSource(SHADERTYPE_COMPUTE, src.str()));

		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		m_testCtx.getLog() << program;
		if (!program.isOk())
			TCU_FAIL("Compile failed");

		gl.useProgram(program.getProgram());
		gl.dispatchCompute(1, 1, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}